

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

void cycle_value_general_undo_redo
               (Am_Object *command_obj,bool undo,bool selective,bool reload_data,int new_val)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_28;
  Am_Object orig_command;
  int local_18;
  int cur_val;
  int new_val_local;
  bool reload_data_local;
  bool selective_local;
  bool undo_local;
  Am_Object *command_obj_local;
  
  Am_Object::Get_Object(&local_28,(Am_Slot_Key)command_obj,0xc);
  if (selective) {
    bVar1 = Am_Object::Valid(&local_28);
    if (bVar1) {
      pAVar2 = Am_Object::Get(&local_28,0x169,0);
      orig_command.data._4_4_ = Am_Value::operator_cast_to_int(pAVar2);
    }
    else {
      orig_command.data._4_4_ = 0;
    }
    if (undo) {
      pAVar2 = Am_Object::Get(command_obj,0x16c,0);
      local_18 = Am_Value::operator_cast_to_int(pAVar2);
    }
    else {
      local_18 = new_val;
      if (!reload_data) {
        pAVar2 = Am_Object::Get(command_obj,0x169,0);
        local_18 = Am_Value::operator_cast_to_int(pAVar2);
      }
    }
  }
  else {
    pAVar2 = Am_Object::Get(command_obj,0x169,0);
    orig_command.data._4_4_ = Am_Value::operator_cast_to_int(pAVar2);
    pAVar2 = Am_Object::Get(command_obj,0x16c,0);
    local_18 = Am_Value::operator_cast_to_int(pAVar2);
  }
  Am_Object::Set(command_obj,0x16c,orig_command.data._4_4_,0);
  Am_Object::Set(command_obj,0x169,local_18,0);
  bVar1 = Am_Object::Valid(&local_28);
  if (bVar1) {
    Am_Object::Set(&local_28,0x169,local_18,0);
  }
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

void
cycle_value_general_undo_redo(Am_Object command_obj, bool undo, bool selective,
                              bool reload_data = false, int new_val = 0)
{
  int cur_val;
  //going to set to new_val, with cur_val as old value for undo
  Am_Object orig_command = command_obj.Get_Object(Am_SOURCE_OF_COPY);
  if (selective) {
    if (orig_command.Valid())
      cur_val = orig_command.Get(Am_VALUE);
    else
      cur_val = 0;
    if (undo)
      new_val = command_obj.Get(Am_OLD_VALUE);
    else if (!reload_data)
      new_val = command_obj.Get(Am_VALUE);
  } else {
    cur_val = command_obj.Get(Am_VALUE);
    new_val = command_obj.Get(Am_OLD_VALUE);
  }
  command_obj.Set(Am_OLD_VALUE, cur_val);
  command_obj.Set(Am_VALUE, new_val);
  if (orig_command.Valid()) {
    orig_command.Set(Am_VALUE, new_val);
  }
}